

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fingergeometry.cpp
# Opt level: O1

int QtMWidgets::FingerGeometry::longTouchBounce(void)

{
  int iVar1;
  int iVar2;
  
  if (longTouchBounce()::bounce == '\0') {
    iVar1 = __cxa_guard_acquire(&longTouchBounce()::bounce);
    if (iVar1 != 0) {
      iVar2 = height();
      iVar1 = width();
      if (iVar1 < iVar2) {
        iVar1 = iVar2;
      }
      longTouchBounce::bounce =
           (int)((double)((ulong)((double)iVar1 * 0.6) & 0x8000000000000000 | (ulong)DAT_00183d10) +
                (double)iVar1 * 0.6);
      __cxa_guard_release(&longTouchBounce()::bounce);
    }
  }
  return longTouchBounce::bounce;
}

Assistant:

int
FingerGeometry::longTouchBounce()
{
	static const int bounce = qRound(
		(qreal) qMax( FingerGeometry::height(), FingerGeometry::width() ) * 0.6 );

	return bounce;
}